

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *__s;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_val_t res [4];
  wasm_extern_t *externs [1];
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_extern_vec_t imports;
  wasm_valtype_vec_t tuple2;
  wasm_valtype_vec_t tuple1;
  wasm_valtype_t *types [4];
  wasm_val_t vals [4];
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar1 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("multi.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar2);
    sVar2 = fread(binary.data,sVar2,1,__stream);
    if (sVar2 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar3 = wasm_module_new(uVar1,&binary);
      if (lVar3 == 0) {
        __s = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Creating callback...");
        types[0] = wasm_valtype_new_i32();
        types[1] = wasm_valtype_new_i64();
        types[2] = wasm_valtype_new_i64();
        types[3] = wasm_valtype_new_i32();
        wasm_valtype_vec_new(&tuple1,4,types);
        wasm_valtype_vec_copy(&tuple2,&tuple1);
        uVar4 = wasm_functype_new(&tuple1,&tuple2);
        uVar5 = wasm_func_new(uVar1,uVar4,callback);
        wasm_functype_delete(uVar4);
        puts("Instantiating module...");
        externs[0] = (wasm_extern_t *)wasm_func_as_extern(uVar5);
        imports.data = externs;
        imports.size = 1;
        lVar6 = wasm_instance_new(uVar1,lVar3,&imports,0);
        if (lVar6 == 0) {
          __s = "> Error instantiating module!";
        }
        else {
          wasm_func_delete(uVar5);
          puts("Extracting export...");
          wasm_instance_exports(lVar6,&exports);
          if (exports.size == 0) {
            __s = "> Error accessing exports!";
          }
          else {
            lVar7 = wasm_extern_as_func(*exports.data);
            if (lVar7 != 0) {
              wasm_module_delete(lVar3);
              wasm_instance_delete(lVar6);
              puts("Calling export...");
              lVar3 = wasm_func_call(lVar7);
              if (lVar3 != 0) {
                puts("> Error calling function!");
                return 1;
              }
              wasm_extern_vec_delete(&exports);
              puts("Printing result...");
              printf("> %u %lu %lu %u\n",0,0,0,0);
              __assert_fail("res[0].of.i32 == 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                            ,0x8f,"int main(int, const char **)");
            }
            __s = "> Error accessing export!";
          }
        }
      }
      goto LAB_001016b5;
    }
  }
  __s = "> Error loading module!";
LAB_001016b5:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("multi.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  wasm_valtype_t* types[4] = {
    wasm_valtype_new_i32(), wasm_valtype_new_i64(),
    wasm_valtype_new_i64(), wasm_valtype_new_i32()
  };
  own wasm_valtype_vec_t tuple1, tuple2;
  wasm_valtype_vec_new(&tuple1, 4, types);
  wasm_valtype_vec_copy(&tuple2, &tuple1);
  own wasm_functype_t* callback_type = wasm_functype_new(&tuple1, &tuple2);
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(callback_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t vals[4] = {
    WASM_I32_VAL(1), WASM_I64_VAL(2), WASM_I64_VAL(3), WASM_I32_VAL(4)
  };
  wasm_val_t res[4] = {
    WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL
  };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vals);
  wasm_val_vec_t results = WASM_ARRAY_VEC(res);
  if (wasm_func_call(run_func, &args, &results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %"PRIu32" %"PRIu64" %"PRIu64" %"PRIu32"\n",
    res[0].of.i32, res[1].of.i64, res[2].of.i64, res[3].of.i32);

  assert(res[0].of.i32 == 4);
  assert(res[1].of.i64 == 3);
  assert(res[2].of.i64 == 2);
  assert(res[3].of.i32 == 1);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}